

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTree.cc
# Opt level: O0

double __thiscall
calculator::ExpressionTree::calcValue(ExpressionTree *this,node *x,node *y,Tag tag)

{
  SyntaxError *this_00;
  DivZeroException *this_01;
  ShiftLeftRightException *pSVar1;
  ShiftNegativeException *pSVar2;
  mapped_type *this_02;
  allocator<char> local_89;
  key_type local_88;
  undefined1 local_65;
  allocator<char> local_51;
  string local_50;
  Tag local_2c;
  node *pnStack_28;
  Tag tag_local;
  node *y_local;
  node *x_local;
  ExpressionTree *this_local;
  
  local_2c = tag;
  pnStack_28 = y;
  y_local = x;
  x_local = (node *)this;
  if ((y == (node *)0x0) || (x == (node *)0x0)) {
    local_65 = 1;
    this_00 = (SyntaxError *)__cxa_allocate_exception(0x28);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_50,"need two operator numbers",&local_51);
    SyntaxError::SyntaxError(this_00,&local_50);
    local_65 = 0;
    __cxa_throw(this_00,&SyntaxError::typeinfo,SyntaxError::~SyntaxError);
  }
  switch(tag) {
  case And:
    this_local = (ExpressionTree *)(double)((long)x->value & (long)y->value);
    break;
  case Or:
    this_local = (ExpressionTree *)(double)((long)x->value | (long)y->value);
    break;
  default:
    this_local = (ExpressionTree *)0x0;
    break;
  case Xor:
    this_local = (ExpressionTree *)(double)((long)x->value ^ (long)y->value);
    break;
  case Add:
    this_local = (ExpressionTree *)(x->value + y->value);
    break;
  case Sub:
    this_local = (ExpressionTree *)(x->value - y->value);
    break;
  case Mul:
    this_local = (ExpressionTree *)(x->value * y->value);
    break;
  case Div:
    if (((y->type == Number) && (y->value == 0.0)) && (!NAN(y->value))) {
      this_01 = (DivZeroException *)__cxa_allocate_exception(0x28);
      DivZeroException::DivZeroException(this_01,y_local->value,(int)pnStack_28->value);
      __cxa_throw(this_01,&DivZeroException::typeinfo,DivZeroException::~DivZeroException);
    }
    this_local = (ExpressionTree *)(x->value / y->value);
    break;
  case Mod:
    this_local = (ExpressionTree *)fmod(x->value,y->value);
    break;
  case ShiftLeft:
    if ((x->type == Float) || (y->type == Float)) {
      pSVar1 = (ShiftLeftRightException *)__cxa_allocate_exception(0x28);
      ShiftLeftRightException::ShiftLeftRightException(pSVar1);
      __cxa_throw(pSVar1,&ShiftLeftRightException::typeinfo,
                  ShiftLeftRightException::~ShiftLeftRightException);
    }
    if (y->value <= 0.0 && y->value != 0.0) {
      pSVar2 = (ShiftNegativeException *)__cxa_allocate_exception(0x28);
      ShiftNegativeException::ShiftNegativeException(pSVar2);
      __cxa_throw(pSVar2,&ShiftNegativeException::typeinfo,
                  ShiftNegativeException::~ShiftNegativeException);
    }
    this_local = (ExpressionTree *)(double)((long)x->value << ((byte)(long)y->value & 0x3f));
    break;
  case ShiftRight:
    if ((x->type == Float) || (y->type == Float)) {
      pSVar1 = (ShiftLeftRightException *)__cxa_allocate_exception(0x28);
      ShiftLeftRightException::ShiftLeftRightException(pSVar1);
      __cxa_throw(pSVar1,&ShiftLeftRightException::typeinfo,
                  ShiftLeftRightException::~ShiftLeftRightException);
    }
    if (y->value <= 0.0 && y->value != 0.0) {
      pSVar2 = (ShiftNegativeException *)__cxa_allocate_exception(0x28);
      ShiftNegativeException::ShiftNegativeException(pSVar2);
      __cxa_throw(pSVar2,&ShiftNegativeException::typeinfo,
                  ShiftNegativeException::~ShiftNegativeException);
    }
    this_local = (ExpressionTree *)(double)((long)x->value >> ((byte)(long)y->value & 0x3f));
    break;
  case Pow:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_88,"pow",&local_89);
    this_02 = std::
              unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<double_(double,_double)>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<double_(double,_double)>_>_>_>
              ::operator[](&(this->lexer_).binary_functions,&local_88);
    this_local = (ExpressionTree *)
                 std::function<double_(double,_double)>::operator()
                           (this_02,y_local->value,pnStack_28->value);
    std::__cxx11::string::~string((string *)&local_88);
    std::allocator<char>::~allocator(&local_89);
  }
  return (double)this_local;
}

Assistant:

double ExpressionTree::calcValue(node *x, node *y, Tag tag) {
    if (y == nullptr || x == nullptr)
        throw SyntaxError("need two operator numbers");
    switch (tag) {
        case Tag::Add:
            return x->value + y->value;
        case Tag::Sub:
            return x->value - y->value;
        case Tag::Mul:
            return x->value * y->value;
        case Tag::Div:
            if (y->type == Tag::Number && y->value == 0) {
                throw DivZeroException(x->value, y->value);
            }
            return x->value / y->value;
        case Tag::Mod:
            return fmod(x->value, y->value);
        case Tag::And:
            return (Integer)x->value & (Integer)y->value;
        case Tag::Or:
            return (Integer)x->value | (Integer)y->value;
        case Tag::Xor:
            return (Integer)x->value ^ (Integer)y->value;
        case Tag::ShiftLeft:
            // 左移或右移的操作数不能是浮点数
            if (x->type == Tag::Float || y->type == Tag::Float)
                throw ShiftLeftRightException();
            // 左移或右移的右操作数不能是负数
            if (y->value < 0) throw ShiftNegativeException();
            return (Integer)x->value << (Integer)y->value;
        case Tag::ShiftRight:
            if (x->type == Tag::Float || y->type == Tag::Float)
                throw ShiftLeftRightException();
            if (y->value < 0) throw ShiftNegativeException();
            return (Integer)x->value >> (Integer)y->value;
        case Tag::Pow:
            return lexer_.binary_functions["pow"](x->value, y->value);
        default:
            break;
    }
    return 0;
}